

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

bool __thiscall
gvr::PLYReader::setReceiver
          (PLYReader *this,string *elem_name,string *prop_name,PLYReceiver *receiver)

{
  PLYElement *pPVar1;
  PLYProperty *this_00;
  PLYReceiver *in_RCX;
  string *in_RSI;
  PLYReader *in_RDI;
  PLYProperty *prop;
  PLYElement *elem;
  bool local_1;
  
  pPVar1 = findElement(in_RDI,in_RSI);
  if ((pPVar1 == (PLYElement *)0x0) ||
     (this_00 = PLYElement::findProperty((PLYElement *)in_RDI,in_RSI), this_00 == (PLYProperty *)0x0
     )) {
    local_1 = false;
  }
  else {
    anon_unknown_3::PLYProperty::setReceiver(this_00,in_RCX);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool PLYReader::setReceiver(const std::string &elem_name, const std::string &prop_name,
                            PLYReceiver *receiver)
{
  PLYElement *elem=findElement(elem_name);

  if (elem != 0)
  {
    PLYProperty *prop=elem->findProperty(prop_name);

    if (prop != 0)
    {
      prop->setReceiver(receiver);
      return true;
    }
  }

  return false;
}